

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

void ConvertBGRAToBGR_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *in_RDX;
  int in_ESI;
  ulong *in_RDI;
  __m128i c6;
  __m128i c2;
  __m128i c4;
  __m128i c0;
  __m128i b4h;
  __m128i b0h;
  __m128i a4h;
  __m128i a0h;
  __m128i a4l;
  __m128i a0l;
  __m128i bgra4;
  __m128i bgra0;
  uint8_t *end;
  __m128i *in;
  __m128i mask_h;
  __m128i mask_l;
  ulong *local_210;
  ulong *local_1e0;
  int local_1d4;
  
  local_210 = in_RDI;
  local_1d4 = in_ESI;
  for (local_1e0 = in_RDX; (long)local_1e0 + 0x1aU <= (ulong)((long)in_RDX + (long)(in_ESI * 3));
      local_1e0 = local_1e0 + 3) {
    uVar1 = local_210[1];
    uVar2 = local_210[2];
    uVar3 = local_210[3];
    *local_1e0 = *local_210 & 0xffffff | (*local_210 & 0xffffff00000000) >> 8;
    *(ulong *)((long)local_1e0 + 6) = uVar1 & 0xffffff | (uVar1 & 0xffffff00000000) >> 8;
    *(ulong *)((long)local_1e0 + 0xc) = uVar2 & 0xffffff | (uVar2 & 0xffffff00000000) >> 8;
    *(ulong *)((long)local_1e0 + 0x12) = uVar3 & 0xffffff | (uVar3 & 0xffffff00000000) >> 8;
    local_1d4 = local_1d4 + -8;
    local_210 = local_210 + 4;
  }
  if (0 < local_1d4) {
    VP8LConvertBGRAToBGR_C((uint32_t *)local_210,local_1d4,(uint8_t *)local_1e0);
  }
  return;
}

Assistant:

static void ConvertBGRAToBGR_SSE2(const uint32_t* WEBP_RESTRICT src,
                                  int num_pixels, uint8_t* WEBP_RESTRICT dst) {
  const __m128i mask_l = _mm_set_epi32(0, 0x00ffffff, 0, 0x00ffffff);
  const __m128i mask_h = _mm_set_epi32(0x00ffffff, 0, 0x00ffffff, 0);
  const __m128i* in = (const __m128i*)src;
  const uint8_t* const end = dst + num_pixels * 3;
  // the last storel_epi64 below writes 8 bytes starting at offset 18
  while (dst + 26 <= end) {
    const __m128i bgra0 = _mm_loadu_si128(in++);     // bgra0|bgra1|bgra2|bgra3
    const __m128i bgra4 = _mm_loadu_si128(in++);     // bgra4|bgra5|bgra6|bgra7
    const __m128i a0l = _mm_and_si128(bgra0, mask_l);   // bgr0|0|bgr0|0
    const __m128i a4l = _mm_and_si128(bgra4, mask_l);   // bgr0|0|bgr0|0
    const __m128i a0h = _mm_and_si128(bgra0, mask_h);   // 0|bgr0|0|bgr0
    const __m128i a4h = _mm_and_si128(bgra4, mask_h);   // 0|bgr0|0|bgr0
    const __m128i b0h = _mm_srli_epi64(a0h, 8);         // 000b|gr00|000b|gr00
    const __m128i b4h = _mm_srli_epi64(a4h, 8);         // 000b|gr00|000b|gr00
    const __m128i c0 = _mm_or_si128(a0l, b0h);          // rgbrgb00|rgbrgb00
    const __m128i c4 = _mm_or_si128(a4l, b4h);          // rgbrgb00|rgbrgb00
    const __m128i c2 = _mm_srli_si128(c0, 8);
    const __m128i c6 = _mm_srli_si128(c4, 8);
    _mm_storel_epi64((__m128i*)(dst +   0), c0);
    _mm_storel_epi64((__m128i*)(dst +   6), c2);
    _mm_storel_epi64((__m128i*)(dst +  12), c4);
    _mm_storel_epi64((__m128i*)(dst +  18), c6);
    dst += 24;
    num_pixels -= 8;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToBGR_C((const uint32_t*)in, num_pixels, dst);
  }
}